

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.cpp
# Opt level: O2

string * pbrt::internal::ToString3<float>(float x,float y,float z)

{
  string *in_RDI;
  float *in_R9;
  float local_14;
  float local_10;
  char local_c [4];
  
  StringPrintf<float&,float&,float&>
            (in_RDI,(pbrt *)"[ %f, %f, %f ]",local_c,&local_10,&local_14,in_R9);
  return in_RDI;
}

Assistant:

std::string internal::ToString3(T x, T y, T z) {
    if (std::is_floating_point<T>::value)
        return StringPrintf("[ %f, %f, %f ]", x, y, z);
    else
        return StringPrintf("[ %d, %d, %d ]", x, y, z);
}